

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O3

Test * SubprocessTestSetWithSingle::Create(void)

{
  Test *pTVar1;
  
  pTVar1 = (Test *)operator_new(0x2d8);
  pTVar1->failed_ = false;
  pTVar1->assertion_failures_ = 0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__SubprocessTest_001fd188;
  SubprocessSet::SubprocessSet((SubprocessSet *)(pTVar1 + 1));
  *(undefined ***)&pTVar1[0x2c].failed_ = &PTR__TokenPool_001fd1c0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__SubprocessTest_001fcff8;
  g_current_test = pTVar1;
  return pTVar1;
}

Assistant:

TEST_F(SubprocessTest, SetWithSingle) {
  Subprocess* subproc = subprocs_.Add(kSimpleCommand);
  ASSERT_NE((Subprocess *) 0, subproc);

  subprocs_.ResetTokenAvailable();
  while (!subproc->Done()) {
    subprocs_.DoWork(NULL);
  }
  ASSERT_FALSE(subprocs_.IsTokenAvailable());
  ASSERT_EQ(ExitSuccess, subproc->Finish());
  ASSERT_NE("", subproc->GetOutput());

  ASSERT_EQ(1u, subprocs_.finished_.size());
}